

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O0

void __thiscall
wasm::ReconstructStringifyWalker::transitionToInSeq(ReconstructStringifyWalker *this)

{
  Module *this_00;
  reference pvVar1;
  Function *func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ulong uVar3;
  size_t sVar4;
  Fatal local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5b8;
  Err *err_3;
  Result<wasm::Ok> _val_3;
  undefined1 auStack_580 [4];
  Index i;
  Signature sig;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Err *err_1;
  undefined1 local_218 [8];
  Result<wasm::Ok> _val_1;
  Fatal local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  Err *err;
  Result<wasm::Ok> _val;
  Function *outlinedFunc;
  ReconstructStringifyWalker *this_local;
  
  this_00 = Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
            ::getModule((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                         *)this);
  pvVar1 = std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::
           operator[](&this->sequences,(ulong)this->seqCounter);
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = (pvVar1->func).super_IString.str._M_len;
  func = Module::getFunction(this_00,(Name)(pvVar1->func).super_IString.str);
  IRBuilder::visitFunctionStart((Result<wasm::Ok> *)&err,&this->outlinedBuilder,func);
  local_58 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err)->msg;
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    Fatal::Fatal(&local_1e0);
    Fatal::operator<<(&local_1e0,local_58);
    Fatal::~Fatal(&local_1e0);
  }
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  IRBuilder::makeCall((Result<wasm::Ok> *)local_218,&this->existingBuilder,
                      (Name)(func->super_Importable).super_Named.name.super_IString.str,false);
  pbVar2 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_218)->msg;
  if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    Fatal::Fatal((Fatal *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    Fatal::operator<<((Fatal *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pbVar2);
    Fatal::~Fatal((Fatal *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_218);
  pvVar1 = std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::
           operator[](&this->sequences,(ulong)this->seqCounter);
  if ((pvVar1->endsTypeUnreachable & 1U) != 0) {
    IRBuilder::makeUnreachable((Result<wasm::Ok> *)&err_2,&this->existingBuilder);
    pbVar2 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2)->msg;
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      Fatal::Fatal((Fatal *)&sig.results);
      Fatal::operator<<((Fatal *)&sig.results,pbVar2);
      Fatal::~Fatal((Fatal *)&sig.results);
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
  }
  _auStack_580 = HeapType::getSignature(&func->type);
  _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_4_ = 0;
  while( true ) {
    uVar3 = (ulong)(uint)_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_;
    sVar4 = wasm::Type::size((Type *)auStack_580);
    if (sVar4 <= uVar3) {
      return;
    }
    IRBuilder::makeLocalGet
              ((Result<wasm::Ok> *)&err_3,&this->outlinedBuilder,
               _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_);
    local_5b8 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_3)->msg;
    if (local_5b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    break;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_3);
    _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ =
         _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ + 1;
  }
  Fatal::Fatal(&local_740);
  Fatal::operator<<(&local_740,local_5b8);
  Fatal::~Fatal(&local_740);
}

Assistant:

void transitionToInSeq() {
    Function* outlinedFunc =
      getModule()->getFunction(sequences[seqCounter].func);
    ASSERT_OK(outlinedBuilder.visitFunctionStart(outlinedFunc));

    // Make a call from the existing function to the outlined function. This
    // call will replace the instructions moved to the outlined function.
    ODBG(std::cerr << "\nadding call " << outlinedFunc->name << " to "
                   << &existingBuilder << "\n");
    ASSERT_OK(existingBuilder.makeCall(outlinedFunc->name, false));

    // If the last instruction of the outlined sequence is unreachable, insert
    // an unreachable instruction immediately after the call to the outlined
    // function. This maintains the unreachable type in the original scope
    // of the outlined sequence.
    if (sequences[seqCounter].endsTypeUnreachable) {
      ODBG(std::cerr << "\nadding endsUnreachable to " << &existingBuilder
                     << "\n");
      ASSERT_OK(existingBuilder.makeUnreachable());
    }

    // Add a local.get instruction for every parameter of the outlined function.
    Signature sig = outlinedFunc->type.getSignature();
    ODBG(std::cerr << outlinedFunc->name << " takes " << sig.params.size()
                   << " parameters\n");
    for (Index i = 0; i < sig.params.size(); i++) {
      ODBG(std::cerr << "adding local.get $" << i << " to " << &outlinedBuilder
                     << "\n");
      ASSERT_OK(outlinedBuilder.makeLocalGet(i));
    }
  }